

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O2

InputStack *
miniscript::internal::operator|(InputStack *__return_storage_ptr__,InputStack a,InputStack b)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  undefined8 uVar5;
  size_t sVar6;
  int *in_RDX;
  int *piVar7;
  int *in_RSI;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *in_RSI;
  piVar7 = in_RDX;
  if ((iVar1 != 0) && (iVar2 = *in_RDX, piVar7 = in_RSI, iVar2 != 0)) {
    if ((char)in_RSI[1] == '\0') {
      if ((char)in_RDX[1] != '\0') goto LAB_00182089;
      *(undefined1 *)((long)in_RSI + 5) = 1;
      *(undefined1 *)((long)in_RDX + 5) = 1;
    }
    else {
      piVar7 = in_RDX;
      if ((char)in_RDX[1] == '\0') goto LAB_00182089;
      if (*(char *)((long)in_RDX + 5) == '\x01') {
        piVar7 = in_RSI;
        if (*(char *)((long)in_RSI + 5) == '\0') goto LAB_00182089;
      }
      else if (*(char *)((long)in_RSI + 5) != '\0') goto LAB_00182089;
    }
    if (iVar1 == 2) {
      piVar7 = in_RDX;
      if ((iVar2 == 2) && (*(ulong *)(in_RDX + 2) <= *(ulong *)(in_RSI + 2))) {
        piVar7 = in_RSI;
      }
    }
    else {
      piVar7 = in_RDX;
      if (((iVar1 == 1) && (piVar7 = in_RSI, iVar2 == 1)) &&
         (piVar7 = in_RDX, *(ulong *)(in_RSI + 2) <= *(ulong *)(in_RDX + 2))) {
        piVar7 = in_RSI;
      }
    }
  }
LAB_00182089:
  uVar5 = *(undefined8 *)piVar7;
  sVar6 = *(size_t *)(piVar7 + 2);
  __return_storage_ptr__->available = (int)uVar5;
  __return_storage_ptr__->has_sig = (bool)(char)((ulong)uVar5 >> 0x20);
  __return_storage_ptr__->malleable = (bool)(char)((ulong)uVar5 >> 0x28);
  __return_storage_ptr__->non_canon = (bool)(char)((ulong)uVar5 >> 0x30);
  __return_storage_ptr__->field_0x7 = (char)((ulong)uVar5 >> 0x38);
  __return_storage_ptr__->size = sVar6;
  iVar1 = piVar7[5];
  iVar2 = piVar7[6];
  iVar4 = piVar7[7];
  *(int *)&(__return_storage_ptr__->stack).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start = piVar7[4];
  *(int *)((long)&(__return_storage_ptr__->stack).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4) = iVar1;
  *(int *)&(__return_storage_ptr__->stack).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = iVar2;
  *(int *)((long)&(__return_storage_ptr__->stack).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar4;
  (__return_storage_ptr__->stack).
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(piVar7 + 8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  piVar7[4] = 0;
  piVar7[5] = 0;
  piVar7[6] = 0;
  piVar7[7] = 0;
  piVar7[8] = 0;
  piVar7[9] = 0;
  return __return_storage_ptr__;
}

Assistant:

InputStack operator|(InputStack a, InputStack b) {
    // If only one is invalid, pick the other one. If both are invalid, pick an arbitrary one.
    if (a.available == Availability::NO) return b;
    if (b.available == Availability::NO) return a;
    // If only one of the solutions has a signature, we must pick the other one.
    if (!a.has_sig && b.has_sig) return a;
    if (!b.has_sig && a.has_sig) return b;
    if (!a.has_sig && !b.has_sig) {
        // If neither solution requires a signature, the result is inevitably malleable.
        a.malleable = true;
        b.malleable = true;
    } else {
        // If both options require a signature, prefer the non-malleable one.
        if (b.malleable && !a.malleable) return a;
        if (a.malleable && !b.malleable) return b;
    }
    // Between two malleable or two non-malleable solutions, pick the smaller one between
    // YESes, and the bigger ones between MAYBEs. Prefer YES over MAYBE.
    if (a.available == Availability::YES && b.available == Availability::YES) {
        return std::move(a.size <= b.size ? a : b);
    } else if (a.available == Availability::MAYBE && b.available == Availability::MAYBE) {
        return std::move(a.size >= b.size ? a : b);
    } else if (a.available == Availability::YES) {
        return a;
    } else {
        return b;
    }
}